

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
ShadingWriter::WriteRGBATiledPatternObject
          (ShadingWriter *this,RadialShading *inRadialShading,PDFRectangle *inBounds,
          PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  EStatusCode EVar1;
  RadialShading *this_00;
  ObjectIDType rgbShadingPatternObjectId;
  ObjectIDType alphaShadingPatternObjectId;
  RadialShading alphaRadialShading;
  ObjectIDType local_a8;
  ObjectIDType local_a0;
  _List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_> local_98;
  RadialShading local_80;
  
  EVar1 = WriteSoftmaskPatternObjectForRGBAShades
                    (this,inBounds,inMatrix,inPatternObjectId,&local_a0,&local_a8);
  if (EVar1 == eSuccess) {
    this_00 = inRadialShading;
    RadialShading::RadialShading(&local_80,inRadialShading);
    CreateAlphaShadingColorLine
              ((InterpretedGradientStopList *)&local_98,(ShadingWriter *)this_00,
               &inRadialShading->colorLine);
    std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::
    _M_move_assign(&local_80.colorLine,&local_98);
    std::__cxx11::_List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::
    _M_clear(&local_98);
    EVar1 = WriteRGBShadingPatternObject(this,&local_80,inBounds,inMatrix,local_a0);
    if (EVar1 == eSuccess) {
      EVar1 = WriteRGBShadingPatternObject(this,inRadialShading,inBounds,inMatrix,local_a8);
    }
    std::__cxx11::_List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::
    _M_clear(&local_80.colorLine.
              super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>);
  }
  return EVar1;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteRGBATiledPatternObject(
    const RadialShading& inRadialShading, 
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    EStatusCode status = eSuccess;
    ObjectIDType alphaShadingPatternObjectId;
    ObjectIDType rgbShadingPatternObjectId;

    do {
        status = WriteSoftmaskPatternObjectForRGBAShades(inBounds, inMatrix, inPatternObjectId, alphaShadingPatternObjectId, rgbShadingPatternObjectId);
        if(status != eSuccess)
            break;

        // now, draw the alpha shading, which has the same pysical properties of the rgb one, but colors are all the alpha
        // component transitioning as a gradient
        RadialShading alphaRadialShading = inRadialShading;
        alphaRadialShading.colorLine = CreateAlphaShadingColorLine(inRadialShading.colorLine);

        status = WriteRGBShadingPatternObject(alphaRadialShading, inBounds, inMatrix, alphaShadingPatternObjectId);
        if(status != eSuccess)
            break;

        status = WriteRGBShadingPatternObject(inRadialShading, inBounds, inMatrix, rgbShadingPatternObjectId);

    } while(false);


    return status;    

}